

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  char *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  istream *piVar9;
  size_t sVar10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  size_t sVar13;
  ostream *poVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  pointer pbVar22;
  uint uVar23;
  pointer pbVar24;
  int iVar25;
  undefined8 in_R8;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  size_type sVar30;
  ulong uVar31;
  long lVar32;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> final_boxes;
  vector<float,_std::allocator<float>_> final_confs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  final_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lex;
  vector<float,_std::allocator<float>_> confidences;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<cv::Mat,_std::allocator<cv::Mat>_> channels;
  string output;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> nm_boxes;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  regions;
  Ptr<cv::text::OCRTesseract> ocr;
  Ptr<cv::text::ERFilter> er_filter2;
  Ptr<cv::text::ERFilter> er_filter1;
  Mat m;
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  nm_region_groups;
  Mat grey;
  Mat image;
  ifstream infile;
  string *psVar33;
  undefined1 local_509;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_508;
  ulong local_4f0;
  void *local_4e8;
  iterator iStack_4e0;
  float *local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  pointer local_490;
  void *local_488;
  pointer pbStack_480;
  Size local_478;
  pointer local_468;
  pointer pbStack_460;
  Size local_458;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_448;
  uint local_42c;
  _InputArray local_428;
  undefined8 local_410;
  void *local_408;
  long lStack_400;
  long local_3f8;
  ulong local_3e8;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  local_3e0;
  ulong local_3c8;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> local_3c0;
  long *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  long *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_390;
  long *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  undefined1 local_378 [96];
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  local_318;
  value_type local_2f8 [3];
  Mat local_298 [8];
  int local_290;
  int local_28c;
  Mat *local_238;
  Mat *pMStack_230;
  ulong local_228 [12];
  Mat local_1c8 [96];
  Mat local_168 [312];
  
  cv::Mat::Mat(local_298);
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Usage: ",0xb);
    pcVar3 = *argv;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c128);
    }
    else {
      sVar10 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <input_image> [<input_txt_lexicon>]",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f8,argv[1],(allocator<char> *)local_378);
    cv::imread((string *)&local_238,(int)local_2f8);
    cv::Mat::operator=(local_298,(Mat *)&local_238);
    cv::Mat::~Mat((Mat *)&local_238);
    paVar1 = &local_2f8[0].field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8[0]._M_dataplus._M_p,
                      CONCAT71(local_2f8[0].field_2._M_allocated_capacity._1_7_,
                               local_2f8[0].field_2._M_local_buf[0]) + 1);
    }
    iVar27 = (int)in_R8;
    local_4a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (argc != 2) {
      std::ifstream::ifstream(&local_238,argv[2],_S_in);
      local_2f8[0]._M_string_length = 0;
      local_2f8[0].field_2._M_local_buf[0] = '\0';
      local_2f8[0]._M_dataplus._M_p = (pointer)paVar1;
      while( true ) {
        piVar9 = std::operator>>((istream *)&local_238,(string *)local_2f8);
        iVar27 = (int)in_R8;
        if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_4a8,local_2f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f8[0]._M_dataplus._M_p,
                        CONCAT71(local_2f8[0].field_2._M_allocated_capacity._1_7_,
                                 local_2f8[0].field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(&local_238);
    }
    local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cv::Mat::Mat((Mat *)local_2f8);
    local_228[0] = 0;
    local_238 = (Mat *)CONCAT44(local_238._4_4_,0x1010000);
    pMStack_230 = local_298;
    local_378._16_4_ = 0;
    local_378._20_4_ = 0;
    local_378._0_4_ = 0x2010000;
    local_378._8_8_ = local_2f8;
    cv::cvtColor((cv *)&local_238,(_InputArray *)local_378,(_OutputArray *)0x7,0,iVar27);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back(&local_448,(value_type *)local_2f8);
    local_428._0_8_ = (char *)0x406fe00000000000;
    local_428.obj = (void *)0x0;
    local_428.sz.width = 0;
    local_428.sz.height = 0;
    local_410 = 0;
    cv::operator-((Scalar_ *)&local_238,(Mat *)&local_428);
    cv::Mat::Mat((Mat *)local_378);
    (**(code **)(*(long *)local_238 + 0x18))(local_238,&local_238,(Mat *)local_378,0xffffffff);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
              (&local_448,(Mat *)local_378);
    cv::Mat::~Mat((Mat *)local_378);
    cv::Mat::~Mat(local_168);
    cv::Mat::~Mat(local_1c8);
    cv::Mat::~Mat((Mat *)local_228);
    local_238 = (Mat *)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"trained_classifierNM1.xml","");
    cv::text::loadClassifierNM1((string *)local_378);
    cv::text::createERFilterNM1((Ptr *)&local_388,(int)local_378,0.00015,0.13,0.2,true,0.1);
    if ((value_type *)local_378._8_8_ != (value_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_);
    }
    if (local_238 != (Mat *)local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    local_238 = (Mat *)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"trained_classifierNM2.xml","");
    cv::text::loadClassifierNM2((string *)local_378);
    cv::text::createERFilterNM2((Ptr *)&local_398,0.5);
    if ((value_type *)local_378._8_8_ != (value_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_);
    }
    if (local_238 != (Mat *)local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::vector(&local_3e0,
             ((long)local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
             (allocator_type *)&local_238);
    if (0 < (int)((ulong)((long)local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555) {
      lVar18 = 0;
      lVar32 = 0;
      lVar20 = 0;
      do {
        pMStack_230 = local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar32;
        local_228[0] = 0;
        local_238._0_4_ = 0x1010000;
        (**(code **)(*local_388 + 0x40))
                  (local_388,&local_238,
                   (long)&((local_3e0.
                            super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar18);
        pMStack_230 = local_448.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar32;
        local_228[0] = 0;
        local_238 = (Mat *)CONCAT44(local_238._4_4_,0x1010000);
        (**(code **)(*local_398 + 0x40))
                  (local_398,&local_238,
                   (long)&((local_3e0.
                            super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar18);
        lVar20 = lVar20 + 1;
        lVar32 = lVar32 + 0x60;
        lVar18 = lVar18 + 0x18;
      } while (lVar20 < (int)((ulong)((long)local_448.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_448.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 5) *
                        -0x55555555);
    }
    local_4c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4d8 = (float *)0x0;
    local_4e8 = (void *)0x0;
    iStack_4e0._M_current = (float *)0x0;
    local_318.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_318.
    super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8 = 0;
    local_408 = (void *)0x0;
    lStack_400 = 0;
    local_378._16_4_ = 0;
    local_378._20_4_ = 0;
    local_378._0_4_ = 0x1010000;
    local_378._8_8_ = local_298;
    local_428.sz.width = 0;
    local_428.sz.height = 0;
    local_428.flags = 0x1050000;
    pMStack_230 = (Mat *)0x0;
    local_228[0] = local_228[0] & 0xffffffffffffff00;
    psVar33 = (string *)&local_238;
    local_428.obj = &local_448;
    local_238 = (Mat *)local_228;
    cv::text::erGrouping
              ((_InputArray *)local_378,&local_428,(vector *)&local_3e0,(vector *)&local_318,
               (vector *)&local_408,0,psVar33,0.5);
    if (local_238 != (Mat *)local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    cv::text::OCRTesseract::create((char *)&local_3a8,(char *)0x0,(char *)0x0,0,3);
    local_428._0_8_ = &local_428.sz;
    local_428.obj = (char *)0x0;
    local_428.sz = (Size)((ulong)local_428.sz & 0xffffffffffffff00);
    if (0 < (int)((ulong)(lStack_400 - (long)local_408) >> 4)) {
      local_4f0 = 0;
      do {
        cv::Mat::zeros((int)(Mat *)&local_238,local_290 + 2,local_28c + 2);
        cv::Mat::Mat((Mat *)local_378);
        (**(code **)(*(long *)local_238 + 0x18))
                  (local_238,(Mat *)&local_238,(pointer)local_378,0xffffffff);
        cv::Mat::~Mat(local_168);
        cv::Mat::~Mat(local_1c8);
        cv::Mat::~Mat((Mat *)local_228);
        std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::vector
                  (&local_3c0,
                   local_318.
                   super__Vector_base<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_4f0);
        er_draw(&local_448,&local_3e0,&local_3c0,(Mat *)local_378);
        if (local_3c0.super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3c0.
                          super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_3c0.
                                super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c0.
                                super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_490 = (pointer)(local_4f0 * 0x10);
        cv::Mat::Mat((Mat *)&local_238,(Mat *)local_378,(Rect_ *)((long)local_408 + (long)local_490)
                    );
        local_458.width = 0;
        local_458.height = 0;
        local_468._0_4_ = 0x2010000;
        pbStack_460 = (pointer)local_378;
        cv::Mat::copyTo((_OutputArray *)&local_238);
        cv::Mat::~Mat((Mat *)&local_238);
        local_458.width = 0;
        local_458.height = 0;
        local_468 = (pointer)CONCAT44(local_468._4_4_,0x1010000);
        local_478.width = 0;
        local_478.height = 0;
        local_488 = (void *)CONCAT44(local_488._4_4_,0x2010000);
        local_228[0] = 0;
        local_228[1] = 0;
        local_238 = (Mat *)0x0;
        pMStack_230 = (Mat *)0x0;
        uVar16 = (ulong)psVar33 & 0xffffffff00000000;
        pbStack_480 = (pointer)local_378;
        pbStack_460 = (pointer)local_378;
        cv::copyMakeBorder((_InputArray *)&local_468,(_OutputArray *)&local_488,0xf,0xf,0xf,0xf,0,
                           (Scalar_ *)&local_238);
        local_228[0] = 0;
        local_238 = (Mat *)0x0;
        pMStack_230 = (Mat *)0x0;
        local_458.width = 0;
        local_458.height = 0;
        local_468 = (pointer)0x0;
        pbStack_460 = (pointer)0x0;
        local_478.width = 0;
        local_478.height = 0;
        local_488 = (void *)0x0;
        pbStack_480 = (pointer)0x0;
        psVar33 = (string *)(uVar16 & 0xffffffff00000000);
        (**(code **)(*local_3a8 + 0x10))
                  (local_3a8,(pointer)local_378,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,(Mat *)&local_238,(_InputArray *)&local_468,
                   (_OutputArray *)&local_488,psVar33);
        local_509 = 10;
        _Var11 = std::
                 __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_428._0_8_,(char *)((long)local_428.obj + local_428._0_8_),
                            (_Iter_equals_val<const_char>)&local_509);
        local_428.obj = _Var11._M_current + -local_428._0_8_;
        *_Var11._M_current = '\0';
        if (((char *)0x2 < local_428.obj) &&
           (0 < (int)((ulong)((long)pMStack_230 - (long)local_238) >> 4))) {
          lVar18 = 0;
          do {
            lVar20 = lVar18 * 0x10;
            *(ulong *)(local_238 + lVar20) =
                 CONCAT44((int)((ulong)*(undefined8 *)(local_238 + lVar20) >> 0x20) +
                          (int)((ulong)*(undefined8 *)((long)local_408 + (long)local_490) >> 0x20) +
                          -0xf,(int)*(undefined8 *)(local_238 + lVar20) +
                               (int)*(undefined8 *)((long)local_408 + (long)local_490) + -0xf);
            uVar16 = local_468[lVar18]._M_string_length;
            if ((1 < uVar16) && (fVar2 = *(float *)((long)local_488 + lVar18 * 4), 51.0 <= fVar2)) {
              pbVar22 = local_468 + lVar18;
              uVar26 = (uint)uVar16;
              if (uVar16 == 2) {
                if ((60.0 <= fVar2) &&
                   (pcVar3 = (pbVar22->_M_dataplus)._M_p, uVar19 = 2, *pcVar3 != pcVar3[1])) {
LAB_00104e94:
                  uVar23 = uVar26 & 0x7fffffff;
                  uVar15 = 0;
                  iVar27 = 0;
                  do {
                    uVar26 = (byte)(pbVar22->_M_dataplus)._M_p[uVar15] - 0x49;
                    if ((uVar26 < 0x24) && ((0x900000001U >> ((ulong)uVar26 & 0x3f) & 1) != 0)) {
                      iVar27 = iVar27 + 1;
                    }
                    uVar15 = uVar15 + 1;
                    uVar26 = uVar19;
                  } while (uVar23 != uVar15);
LAB_00104ecd:
                  if (iVar27 <= (int)((uVar26 - ((int)(uVar26 + 1) >> 0x1f)) + 1) >> 1) {
                    if (local_4a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        local_4a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      pcVar5 = (pbVar22->_M_dataplus)._M_p;
                      uVar15 = 0;
                      do {
                        iVar27 = toupper((int)pcVar5[uVar15]);
                        pcVar5[uVar15] = (char)iVar27;
                        uVar15 = uVar15 + 1;
                      } while (uVar16 != uVar15);
                      _Var12 = std::
                               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                         (local_4a8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          local_4a8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          local_468 + lVar18);
                      if (_Var12._M_current ==
                          local_4a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        *(undefined4 *)((long)local_488 + lVar18 * 4) = 0x43480000;
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&local_4c8,local_468 + lVar18);
                    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::push_back
                              (&local_508,(value_type *)(local_238 + lVar20));
                    pfVar21 = (float *)(lVar18 * 4 + (long)local_488);
                    if (iStack_4e0._M_current == local_4d8) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                ((vector<float,std::allocator<float>> *)&local_4e8,iStack_4e0,
                                 pfVar21);
                    }
                    else {
                      *iStack_4e0._M_current = *pfVar21;
                      iStack_4e0._M_current = iStack_4e0._M_current + 1;
                    }
                  }
                }
              }
              else if ((3 < uVar16) || (60.0 <= fVar2)) {
                uVar19 = uVar26;
                if (0 < (int)uVar26) goto LAB_00104e94;
                iVar27 = 0;
                goto LAB_00104ecd;
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)((ulong)((long)pMStack_230 - (long)local_238) >> 4));
        }
        if (local_488 != (void *)0x0) {
          operator_delete(local_488,(long)local_478 - (long)local_488);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_468);
        if (local_238 != (Mat *)0x0) {
          operator_delete(local_238,local_228[0] - (long)local_238);
        }
        cv::Mat::~Mat((Mat *)local_378);
        local_4f0 = local_4f0 + 1;
      } while ((long)local_4f0 < (long)(int)((ulong)(lStack_400 - (long)local_408) >> 4));
    }
    if (local_4c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_4c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 0;
      uVar15 = 0;
      pbVar22 = local_4c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar24 = local_4c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar19 = (int)uVar15 + 1;
        uVar31 = (ulong)(int)uVar19;
        uVar26 = 0xffffffff;
        local_4f0 = uVar15;
        local_42c = uVar19;
        local_3e8 = uVar16;
        local_3c8 = uVar31;
        if (uVar31 < (ulong)((long)pbVar24 - (long)pbVar22 >> 5)) {
          do {
            iVar27 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16].x;
            iVar28 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16].y;
            iVar25 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar31].x;
            iVar29 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar31].y;
            iVar6 = iVar25;
            if (iVar25 < iVar27) {
              iVar6 = iVar27;
            }
            iVar7 = iVar29;
            if (iVar29 < iVar28) {
              iVar7 = iVar28;
            }
            iVar27 = iVar27 + local_508.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar16].width;
            iVar25 = iVar25 + local_508.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar31].width;
            if (iVar27 <= iVar25) {
              iVar25 = iVar27;
            }
            iVar28 = iVar28 + local_508.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar16].height;
            iVar29 = iVar29 + local_508.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar31].height;
            if (iVar28 <= iVar29) {
              iVar29 = iVar28;
            }
            iVar27 = (iVar29 - iVar7) * (iVar25 - iVar6);
            if (iVar29 - iVar7 < 1) {
              iVar27 = 0;
            }
            if (iVar25 - iVar6 < 1) {
              iVar27 = 0;
            }
            iVar28 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16].height *
                     local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16].width;
            iVar25 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar31].height *
                     local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar31].width;
            local_490 = pbVar24;
            if (((0.5 < (float)iVar27 / (float)((iVar25 + iVar28) - iVar27)) ||
                ((double)iVar28 * 0.8 < (double)iVar27)) || ((double)iVar25 * 0.8 < (double)iVar27))
            {
              fVar2 = *(float *)((long)local_4e8 + uVar31 * 4);
              pfVar21 = (float *)((long)local_4e8 + local_3e8 * 4);
              uVar26 = uVar19;
              if (*pfVar21 <= fVar2 && fVar2 != *pfVar21) {
                uVar26 = (uint)local_4f0;
              }
              if (uVar26 != uVar19) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase(&local_4c8,pbVar22 + uVar31);
              if ((local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar31 + 1 !=
                   local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish) &&
                 (lVar18 = (long)local_508.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_508.
                                  super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar31 + 1) >> 4,
                 0 < lVar18)) {
                uVar15 = lVar18 + 1;
                piVar17 = &local_508.
                           super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar31 + 1].height;
                do {
                  *(Rect_<int> *)(piVar17 + -7) = *(Rect_<int> *)(piVar17 + -3);
                  uVar15 = uVar15 - 1;
                  piVar17 = piVar17 + 4;
                } while (1 < uVar15);
              }
              local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
              pfVar21 = (float *)((long)local_4e8 + uVar31 * 4 + 4);
              if (pfVar21 != iStack_4e0._M_current) {
                memmove((void *)((long)local_4e8 + uVar31 * 4),pfVar21,
                        (long)iStack_4e0._M_current - (long)pfVar21);
              }
              iStack_4e0._M_current = iStack_4e0._M_current + -1;
              pbVar22 = local_4c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar24 = local_4c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar26 = uVar19;
            }
            else {
              uVar19 = uVar19 + 1;
              uVar26 = 0xffffffff;
            }
            uVar31 = (ulong)(int)uVar19;
          } while (uVar31 < (ulong)((long)pbVar24 - (long)pbVar22 >> 5));
        }
        uVar8 = local_3e8;
        uVar31 = local_4f0;
        uVar19 = (uint)local_4f0;
        uVar15 = (ulong)local_42c;
        uVar16 = local_3c8;
        if (uVar26 == uVar19) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_4c8,pbVar22 + local_3e8);
          if ((local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar8 + 1 !=
               local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             (lVar18 = (long)local_508.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_508.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar8 + 1) >> 4, 0 < lVar18
             )) {
            uVar16 = lVar18 + 1;
            piVar17 = &local_508.
                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8 + 1].height;
            do {
              *(Rect_<int> *)(piVar17 + -7) = *(Rect_<int> *)(piVar17 + -3);
              uVar16 = uVar16 - 1;
              piVar17 = piVar17 + 4;
            } while (1 < uVar16);
          }
          local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
          pfVar21 = (float *)((long)local_4e8 + uVar8 * 4 + 4);
          if (pfVar21 != iStack_4e0._M_current) {
            memmove((void *)((long)local_4e8 + uVar8 * 4),pfVar21,
                    (long)iStack_4e0._M_current - (long)pfVar21);
          }
          iStack_4e0._M_current = iStack_4e0._M_current + -1;
          uVar16 = (ulong)(int)uVar19;
          uVar15 = uVar31 & 0xffffffff;
          pbVar22 = local_4c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar24 = local_4c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      } while (uVar16 < (ulong)((long)pbVar24 - (long)pbVar22 >> 5));
    }
    if (local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar16 = 0;
      do {
        if (local_4a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_4a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
LAB_001054b8:
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               local_508.
                               super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar16].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              (poVar14,local_508.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar16].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          iVar28 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].width +
                   local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].x;
          iVar27 = local_28c + -2;
          if (iVar28 <= local_28c + -2) {
            iVar27 = iVar28;
          }
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              (poVar14,local_508.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar16].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          iVar28 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].width +
                   local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].x;
          iVar27 = local_28c + -2;
          if (iVar28 <= local_28c + -2) {
            iVar27 = iVar28;
          }
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          iVar28 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].height +
                   local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].y;
          iVar27 = local_290 + -2;
          if (iVar28 <= local_290 + -2) {
            iVar27 = iVar28;
          }
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              (poVar14,local_508.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar16].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          iVar28 = local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].height +
                   local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16].y;
          iVar27 = local_290 + -2;
          if (iVar28 <= local_290 + -2) {
            iVar27 = iVar28;
          }
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,local_4c8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus
                                       ._M_p,
                               local_4c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
        }
        else {
          sVar4 = local_4c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_string_length;
          if (sVar4 != 0) {
            pcVar5 = local_4c8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p;
            sVar30 = 0;
            do {
              iVar27 = toupper((int)pcVar5[sVar30]);
              pcVar5[sVar30] = (char)iVar27;
              sVar30 = sVar30 + 1;
            } while (sVar4 != sVar30);
          }
          _Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (local_4a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              local_4a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              local_4c8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16);
          if (_Var12._M_current !=
              local_4a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001054b8;
          iVar27 = (int)local_4c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_string_length;
          if (_Var12._M_current !=
              local_4a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar18 = 0;
            uVar15 = 0;
            do {
              sVar13 = edit_distance((string *)
                                     ((long)&((local_4a8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar18),
                                     local_4c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar16);
              if ((int)sVar13 <= iVar27) {
                iVar27 = (int)sVar13;
              }
              uVar15 = uVar15 + 1;
              lVar18 = lVar18 + 0x20;
            } while (uVar15 < (ulong)((long)local_4a8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_4a8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          if ((ulong)(long)iVar27 <
              local_4c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_string_length) {
            std::__cxx11::string::_M_assign
                      ((string *)
                       (local_4c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar16));
            goto LAB_001054b8;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)((long)local_508.
                                      super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_508.
                                      super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    if ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_428._0_8_ !=
        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_428.sz) {
      operator_delete((void *)local_428._0_8_,(long)local_428.sz + 1);
    }
    if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0);
    }
    if (local_408 != (void *)0x0) {
      operator_delete(local_408,local_3f8 - (long)local_408);
    }
    std::
    vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ::~vector(&local_318);
    if (local_4e8 != (void *)0x0) {
      operator_delete(local_4e8,(long)local_4d8 - (long)local_4e8);
    }
    if (local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_508.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_508.
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4c8);
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::~vector(&local_3e0);
    if (local_390 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_390);
    }
    if (local_380 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_380);
    }
    cv::Mat::~Mat((Mat *)local_2f8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_448);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4a8);
  }
  cv::Mat::~Mat(local_298);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    Mat image;
    if(argc>1)
    {
        image  = imread(argv[1]);
    }
    else
    {
        cout << "    Usage: " << argv[0] << " <input_image> [<input_txt_lexicon>]" << endl;
        return(0);
    }

    // Load lexicon if provided
    vector<string> lex;
    if(argc>2)
    {
        ifstream infile(argv[2]);
        string lex_word;
        while (infile >> lex_word)
        {
            lex.push_back(lex_word);
        }
    }

    /*Text Detection*/

    // Extract channels to be processed individually
    vector<Mat> channels;

    Mat grey;
    cvtColor(image,grey,COLOR_RGB2GRAY);


    // Extract channels to be processed individually
    // computeNMChannels(image, channels);
    // Notice here we are only using grey channel.
    channels.push_back(grey);
    channels.push_back(255-grey);

    // Create ERFilter objects with the 1st and 2nd stage default classifiers
    Ptr<ERFilter> er_filter1 = createERFilterNM1(loadClassifierNM1("trained_classifierNM1.xml"),8,0.00015f,0.13f,0.2f,true,0.1f);
    Ptr<ERFilter> er_filter2 = createERFilterNM2(loadClassifierNM2("trained_classifierNM2.xml"),0.5);

    vector<vector<ERStat> > regions(channels.size());
    // Apply the default cascade classifier to each independent channel
    for (int c=0; c<(int)channels.size(); c++)
    {
        er_filter1->run(channels[c], regions[c]);
        er_filter2->run(channels[c], regions[c]);
    }

    vector<string> final_words;
    vector<Rect>   final_boxes;
    vector<float>  final_confs;


    // Detect character groups
    vector< vector<Vec2i> > nm_region_groups;
    vector<Rect> nm_boxes;
    erGrouping(image, channels, regions, nm_region_groups, nm_boxes,ERGROUPING_ORIENTATION_HORIZ);



    /*Text Recognition (OCR)*/

    Ptr<OCRTesseract> ocr = OCRTesseract::create();
    string output;


    for (int i=0; i<(int)nm_boxes.size(); i++)
    {

        Mat group_img = Mat::zeros(image.rows+2, image.cols+2, CV_8UC1);
        er_draw(channels, regions, nm_region_groups[i], group_img);
        group_img(nm_boxes[i]).copyTo(group_img);
        copyMakeBorder(group_img,group_img,15,15,15,15,BORDER_CONSTANT,Scalar(0));

        vector<Rect>   boxes;
        vector<string> words;
        vector<float>  confidences;
        ocr->run(group_img, output, &boxes, &words, &confidences, OCR_LEVEL_WORD);

        output.erase(remove(output.begin(), output.end(), '\n'), output.end());
        //cout << "OCR output = \"" << output << "\" lenght = " << output.size() << endl;
        if (output.size() < 3)
            continue;

        for (int j=0; j<(int)boxes.size(); j++)
        {
            boxes[j].x += nm_boxes[i].x-15;
            boxes[j].y += nm_boxes[i].y-15;

            /* Filter words with low confidence, or less than 3 chars, or noisy recognitions */
            // Threshold values have been set using the ICDAR train set.
            //cout << "  word = " << words[j] << "\t confidence = " << confidences[j] << endl;
            if ((words[j].size() < 2) || (confidences[j] < 51) ||
                    ((words[j].size()==2) && (words[j][0] == words[j][1])) ||
                    ((words[j].size()< 4) && (confidences[j] < 60)) ||
                    isRepetitive(words[j]))
                continue;

            /* Increase confidence of predicted words matching a word in the lexicon */
            if (lex.size() > 0)
            {
                std::transform(words[j].begin(), words[j].end(), words[j].begin(), ::toupper);
                if (find(lex.begin(), lex.end(), words[j]) == lex.end())
                    confidences[j] = 200;
            }

            final_words.push_back(words[j]);
            final_boxes.push_back(boxes[j]);
            final_confs.push_back(confidences[j]);
        }

    }


    /* Non Maximal Suppression using OCR confidence */
    float thr = 0.5;

    for (int i=0; i<final_words.size(); )
    {
        int to_delete = -1;
        for (int j=i+1; j<final_words.size(); )
        {
            to_delete = -1;
            Rect intersection = final_boxes[i] & final_boxes[j];
            float IoU = (float)intersection.area() / (final_boxes[i].area() + final_boxes[j].area() - intersection.area());
            if ((IoU > thr) || (intersection.area() > 0.8*final_boxes[i].area()) || (intersection.area() > 0.8*final_boxes[j].area()))
            {
                // if regions overlap more than thr delete the one with lower confidence
                to_delete = (final_confs[i] < final_confs[j]) ? i : j;

                if (to_delete == j )
                {
                    final_words.erase(final_words.begin()+j);
                    final_boxes.erase(final_boxes.begin()+j);
                    final_confs.erase(final_confs.begin()+j);
                    continue;
                } else {
                    break;
                }
            }
            j++;
        }
        if (to_delete == i )
        {
            final_words.erase(final_words.begin()+i);
            final_boxes.erase(final_boxes.begin()+i);
            final_confs.erase(final_confs.begin()+i);
            continue;
        }
        i++;
    }

    /* Predicted words which are not in the lexicon are filtered
       or changed to match one (when edit distance ratio < 0.34)*/
    float max_edit_distance_ratio = 0.34;
    for (int j=0; j<final_boxes.size(); j++)
    {

        if (lex.size() > 0)
        {
            std::transform(final_words[j].begin(), final_words[j].end(), final_words[j].begin(), ::toupper);
            if (find(lex.begin(), lex.end(), final_words[j]) == lex.end())
            {
                int best_match = -1;
                int best_dist  = final_words[j].size();
                for (int l=0; l<lex.size(); l++)
                {
                    int dist = edit_distance(lex[l],final_words[j]);
                    if (dist < best_dist)
                    {
                        best_match = l;
                        best_dist = dist;
                    }
                }
                if (best_dist/final_words[j].size() < max_edit_distance_ratio)
                    final_words[j] = lex[best_match];
                else
                    continue;
            }
        }

        // Output final recognition in csv format compatible with the ICDAR Robust Reading Competition
        cout << final_boxes[j].tl().x << ","
             << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2)
             << "," << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2) << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_boxes[j].tl().x << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_words[j] << endl ;
    }

    return 0;
}